

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O3

_Bool borg_flow_take_lunal(_Bool viewable,wchar_t nearness)

{
  borg_take *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  _Bool _Var6;
  wchar_t wVar7;
  loc_conflict grid2;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  ulong uVar13;
  uint8_t *puVar14;
  object_kind *poVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  if (borg_takes_cnt != 0) {
    if (track_less.num < 1) {
      wVar7 = L'\xffffffff';
    }
    else {
      uVar16 = 0xffffffff;
      uVar17 = 0;
      wVar11 = L'\xffffffff';
      do {
        grid2 = loc(track_less.x[uVar17],track_less.y[uVar17]);
        wVar7 = distance(borg.c,grid2);
        wVar12 = wVar11;
        if (wVar11 <= wVar7) {
          wVar12 = wVar7;
        }
        if (wVar11 < wVar7) {
          uVar16 = uVar17 & 0xffffffff;
        }
        wVar7 = (wchar_t)uVar16;
        uVar17 = uVar17 + 1;
        wVar11 = wVar12;
      } while ((long)uVar17 < (long)track_less.num);
    }
    borg_temp_n = 0;
    if (1 < borg_takes_nxt) {
      lVar18 = 1;
      do {
        poVar15 = borg_takes[lVar18].kind;
        if (poVar15 != (object_kind *)0x0) {
          pbVar1 = borg_takes + lVar18;
          bVar2 = pbVar1->x;
          bVar3 = pbVar1->y;
          uVar16 = (ulong)bVar3;
          if (pbVar1->tval == L'#') {
            bVar10 = false;
            pcVar8 = format("# Lunal Item %s, at %d,%d");
            borg_note(pcVar8);
          }
          else {
            bVar10 = true;
            if (L'\0' < pbVar1->value) {
              _Var6 = borg_is_ammo(pbVar1->tval);
              if (_Var6) {
                if ((ulong)z_info->quiver_size != 0) {
                  uVar13 = (ulong)z_info->pack_size;
                  uVar17 = uVar13 + 0xc;
                  puVar14 = &borg_items[uVar13 + 0xc].iqty;
                  bVar10 = true;
                  do {
                    if (((*puVar14 != 0) && (z_info->quiver_slot_size != (ushort)*puVar14)) &&
                       ((pbVar1->kind->kidx == *(uint32_t *)(puVar14 + -0xc) &&
                        (poVar15->sval == (uint)puVar14[-3])))) {
                      bVar10 = (bool)(bVar10 & poVar15->tval != (uint)puVar14[-4]);
                    }
                    uVar17 = uVar17 + 1;
                    puVar14 = puVar14 + 0x388;
                  } while (uVar17 < z_info->quiver_size + uVar13 + 0xc);
                }
              }
              else {
                uVar4 = z_info->pack_size;
                uVar5 = borg.trait[0x9e];
                if ((borg_items[(int)(~uVar5 + (uint)uVar4)].iqty != '\0') &&
                   (uVar4 - uVar5 != 0 && (int)uVar5 <= (int)(uint)uVar4)) {
                  bVar10 = true;
                  lVar9 = 0;
                  do {
                    if (((borg_items->curses[lVar9 + -0x26] != false) &&
                        (pbVar1->kind->kidx == *(uint32_t *)(borg_items->curses + lVar9 + -0x32)))
                       && (poVar15->sval == (uint)borg_items->curses[lVar9 + -0x29])) {
                      bVar10 = (bool)(bVar10 & ((byte)(borg_items->curses[lVar9 + -0x2a] - 0x1bU) <
                                                0xfd || poVar15->tval !=
                                                        (uint)borg_items->curses[lVar9 + -0x2a]));
                    }
                    lVar9 = lVar9 + 0x388;
                  } while ((ulong)(uVar4 - uVar5) * 0x388 - lVar9 != 0);
                }
              }
            }
          }
          if (((borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty == '\0') &&
              (bVar10)) &&
             ((_Var6 = borg_is_ammo(pbVar1->tval), !_Var6 ||
              (borg_items[(ulong)z_info->quiver_size + (ulong)z_info->pack_size + 0xb].iqty == '\0')
              ))) {
            poVar15 = pbVar1->kind;
            if (((pbVar1->tval == L'\x1a') && (sv_potion_inc_str <= poVar15->sval)) &&
               (poVar15->sval <= sv_potion_detect_invis)) {
              pcVar8 = format("# Lunal Item %s, at %d,%d",poVar15->name,uVar16,(ulong)bVar2);
              borg_note(pcVar8);
              poVar15 = pbVar1->kind;
            }
            _Var6 = flag_has_dbg(poVar15->kind_flags,2,4,"take->kind->kind_flags","KF_INSTA_ART");
            if (_Var6) {
              pcVar8 = format("# Lunal Item %s, at %d,%d",pbVar1->kind->name,uVar16);
              borg_note(pcVar8);
            }
          }
          if (((!viewable) || ((borg_grids[uVar16][bVar2].info & 0x20) != 0)) &&
             (_Var6 = borg_flow_far_from_stairs((uint)bVar2,(uint)bVar3,wVar7), !_Var6)) {
            borg_temp_x[borg_temp_n] = bVar2;
            borg_temp_y[borg_temp_n] = bVar3;
            borg_temp_n = borg_temp_n + 1;
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < borg_takes_nxt);
      if (borg_temp_n != 0) {
        borg_flow_clear();
        if (0 < borg_temp_n) {
          lVar18 = 0;
          do {
            borg_flow_enqueue_grid((uint)borg_temp_y[lVar18],(uint)borg_temp_x[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 < borg_temp_n);
        }
        borg_flow_spread(nearness,false,!viewable,false,L'\xffffffff',true);
        _Var6 = borg_flow_commit("munchkin item",L'\x02');
        if (!_Var6) {
          return false;
        }
        _Var6 = borg_check_light();
        if (_Var6) {
          return true;
        }
        _Var6 = borg_flow_old(L'\x02');
        return _Var6;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_take_lunal(bool viewable, int nearness)
{
    int i, ii, x, y;
    int j;
    int b_j     = -1;
    int b_stair = -1;

    borg_grid *ag;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Nothing yet */
    borg_temp_n = 0;

    /* Scan the object list -- set filter*/
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take          *take  = &borg_takes[i];
        struct object_kind *k_ptr = take->kind;

        bool item_bad;

        /* Skip dead objects */
        if (!k_ptr)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* all items start bad */
        item_bad = true;

        /* Gold is good to have */
        if (take->tval == TV_GOLD) {
            borg_note(
                format("# Lunal Item %s, at %d,%d", take->kind->name, y, x));
            item_bad = false;
        }

        /* If full can I absorb the item into an existing stack */
        if (item_bad && take->value > 0) {
            if (borg_is_ammo(take->tval)) {
                /* Scan the quiver */
                for (ii = QUIVER_START; ii < QUIVER_END; ii++) {
                    /* skip empty slots */
                    if (!borg_items[ii].iqty)
                        continue;

                    /* skip full slots */
                    if (borg_items[ii].iqty == z_info->quiver_slot_size)
                        continue;

                    /* Both objects should have the same kind value */
                    if (take->kind->kidx != borg_items[ii].kind)
                        continue;

                    if (k_ptr->sval == borg_items[ii].sval
                        && k_ptr->tval == borg_items[ii].tval) {
                        item_bad = false;
                    }
                }
            } else if (borg_items[PACK_SLOTS - 1].iqty) {
                /* Scan the inventory */
                for (ii = 0; ii < PACK_SLOTS; ii++) {
                    /* skip empty slots */
                    if (!borg_items[ii].iqty)
                        continue;

                    /* Both objects should have the same kind value */
                    if (take->kind->kidx != borg_items[ii].kind)
                        continue;

                    /* Certain types of items can stack */
                    if (k_ptr->sval == borg_items[ii].sval
                        && k_ptr->tval == borg_items[ii].tval
                        && (borg_items[ii].tval == TV_POTION
                            || borg_items[ii].tval == TV_SCROLL
                            || borg_items[ii].tval == TV_ROD)) {
                        item_bad = false;
                    }
                }
            }
        }

        /* Require one empty slot */
        if (!borg_items[PACK_SLOTS - 1].iqty && item_bad == true) {
            /* for ammo, make sure the quiver isn't full */
            if (!borg_is_ammo(take->tval)
                || borg_items[QUIVER_END - 1].iqty == 0) {

                /* Certain Potions are worthless */
                if (take->tval == TV_POTION
                    && (take->kind->sval >= sv_potion_inc_str)
                    && (take->kind->sval <= sv_potion_detect_invis)) {
                    borg_note(format(
                        "# Lunal Item %s, at %d,%d", take->kind->name, y, x));
                    item_bad = false;
                }

                /* Certain insta_arts are good.  Note that there is no top end
                 * of this.  So if an item were added after the last artifact,
                 * it would also be picked up.
                 */
                if (kf_has(take->kind->kind_flags, KF_INSTA_ART)) {
                    borg_note(format(
                        "# Lunal Item %s, at %d,%d", take->kind->name, y, x));
                    item_bad = false;
                }

                /* if scumming the start of the game, take all items to sell
                 * them */
                if (borg_cfg[BORG_MUNCHKIN_START]) {
                    /* Certain known items are junky and should be ignored. Grab
                     * only things of value
                     */
                    if (take->value >= 1)
                        item_bad = false;
                }
            }
        }

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unknown squares.  This was for performance. */
    borg_flow_spread(nearness, false, !viewable, false, -1, true);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("munchkin item", GOAL_TAKE))
        return false;

    /* Check for monsters before walking over to the item */
    if (borg_check_light())
        return true;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}